

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O2

string * stripPostfix(string *__return_storage_ptr__,string *value,string *postfix)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> __x;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,value);
  __x._M_str = (postfix->_M_dataplus)._M_p;
  __x._M_len = postfix->_M_string_length;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::ends_with
                    (__return_storage_ptr__,__x);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (__return_storage_ptr__,
               __return_storage_ptr__->_M_string_length - postfix->_M_string_length,
               0xffffffffffffffff);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string stripPostfix( std::string const & value, std::string const & postfix )
{
  std::string strippedValue = value;
  if ( strippedValue.ends_with( postfix ) )
  {
    strippedValue.erase( strippedValue.length() - postfix.length() );
  }
  return strippedValue;
}